

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O1

bool crn_decompress_block(void *pSrc_block,crn_uint32 *pDst_pixels_u32,crn_format crn_fmt)

{
  uchar uVar1;
  color_quad_u8 *pcVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  crn_format cVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  color_quad_u8 *pcVar14;
  dxt1_block *pDXT1_block;
  uint i_2;
  color_quad_u8 colors [4];
  color_quad_u8 colors_2 [4];
  color_quad_u8 acStack_68 [8];
  color_quad_u8 local_48 [8];
  
  cVar7 = crnd::crnd_get_fundamental_dxt_format(crn_fmt);
  bVar4 = false;
  switch(cVar7) {
  case cCRNFmtDXT1:
    crnlib::dxt1_block::get_block_colors(acStack_68,*pSrc_block,*(uint16 *)((long)pSrc_block + 2));
    bVar3 = 0;
    uVar10 = 0;
    do {
      uVar5 = *(byte *)((long)pSrc_block + (uVar10 >> 2 & 0x3fffffff) + 4) >> (bVar3 & 6) & 3;
      *(uchar *)(pDst_pixels_u32 + uVar10) = acStack_68[uVar5].field_0.field_0.r;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 1) = acStack_68[uVar5].field_0.field_0.g;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 2) = acStack_68[uVar5].field_0.field_0.b;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 3) = acStack_68[uVar5].field_0.field_0.a;
      uVar10 = uVar10 + 1;
      bVar3 = bVar3 + 2;
    } while (uVar10 != 0x10);
    break;
  case cCRNFmtDXT3:
    crnlib::dxt1_block::get_block_colors
              (acStack_68,*(uint16 *)((long)pSrc_block + 8),*(uint16 *)((long)pSrc_block + 10));
    uVar10 = 0;
    do {
      uVar5 = (uint)uVar10 & 3;
      uVar11 = uVar10 >> 2 & 0x3fffffff;
      uVar9 = *(byte *)((long)pSrc_block + uVar11 + 0xc) >> (char)uVar5 * '\x02' & 3;
      uVar6 = crnlib::dxt3_block::get_alpha((dxt3_block *)pSrc_block,uVar5,(uint)uVar11,true);
      *(uchar *)(pDst_pixels_u32 + uVar10) = acStack_68[uVar9].field_0.field_0.r;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 1) = acStack_68[uVar9].field_0.field_0.g;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 2) = acStack_68[uVar9].field_0.field_0.b;
      *(char *)((long)pDst_pixels_u32 + uVar10 * 4 + 3) = (char)uVar6;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 0x10);
    break;
  case cCRNFmtDXT5:
    crnlib::dxt1_block::get_block_colors
              (local_48,*(uint16 *)((long)pSrc_block + 8),*(uint16 *)((long)pSrc_block + 10));
    crnlib::dxt5_block::get_block_values
              ((uint *)acStack_68,(uint)*pSrc_block,(uint)*(byte *)((long)pSrc_block + 1));
    uVar5 = 0;
    bVar3 = 0;
    uVar10 = 0;
    do {
      bVar8 = *(byte *)((long)pSrc_block + (ulong)(uVar5 >> 3) + 2);
      uVar9 = (uint)bVar8;
      if (uVar10 < 0xe) {
        uVar9 = (uint)CONCAT11(*(undefined1 *)((long)pSrc_block + (ulong)(uVar5 >> 3) + 3),bVar8);
      }
      uVar13 = *(byte *)((long)pSrc_block + (uVar10 >> 2 & 0x3fffffff) + 0xc) >> (bVar3 & 6) & 3;
      *(uchar *)(pDst_pixels_u32 + uVar10) = local_48[uVar13].field_0.field_0.r;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 1) = local_48[uVar13].field_0.field_0.g;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 2) = local_48[uVar13].field_0.field_0.b;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 3) = local_48[uVar13].field_0.field_0.a;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 3) =
           acStack_68[uVar9 >> ((byte)uVar5 & 7) & 7].field_0.field_0.r;
      uVar10 = uVar10 + 1;
      bVar3 = bVar3 + 2;
      uVar5 = uVar5 + 3;
    } while (uVar10 != 0x10);
  case cCRNFmtDXN_XY:
  case cCRNFmtDXN_YX:
    crnlib::dxt5_block::get_block_values
              ((uint *)acStack_68,(uint)*pSrc_block,(uint)*(byte *)((long)pSrc_block + 1));
    crnlib::dxt5_block::get_block_values
              ((uint *)local_48,(uint)*(byte *)((long)pSrc_block + 8),
               (uint)*(byte *)((long)pSrc_block + 9));
    pcVar14 = acStack_68;
    pcVar2 = local_48;
    if (crn_fmt == cCRNFmtDXN_XY) {
      pcVar14 = local_48;
      pcVar2 = acStack_68;
    }
    uVar5 = 0;
    uVar10 = 0;
    do {
      uVar11 = (ulong)(uVar5 >> 3);
      bVar3 = *(byte *)((long)pSrc_block + uVar11 + 2);
      uVar9 = (uint)bVar3;
      if (uVar10 < 0xe) {
        uVar9 = (uint)CONCAT11(*(undefined1 *)((long)pSrc_block + uVar11 + 3),bVar3);
      }
      bVar8 = (byte)uVar5 & 7;
      bVar3 = *(byte *)((long)pSrc_block + uVar11 + 10);
      uVar13 = (uint)bVar3;
      if (uVar10 < 0xe) {
        uVar13 = (uint)CONCAT11(*(undefined1 *)((long)pSrc_block + uVar11 + 0xb),bVar3);
      }
      uVar12 = uVar9 >> bVar8 & 7;
      uVar13 = uVar13 >> bVar8 & 7;
      uVar9 = uVar13;
      if (crn_fmt == cCRNFmtDXN_XY) {
        uVar9 = uVar12;
      }
      if (crn_fmt != cCRNFmtDXN_XY) {
        uVar13 = uVar12;
      }
      uVar1 = pcVar14[uVar13].field_0.field_0.r;
      *(uchar *)(pDst_pixels_u32 + uVar10) = pcVar2[uVar9].field_0.field_0.r;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 1) = uVar1;
      *(undefined2 *)((long)pDst_pixels_u32 + uVar10 * 4 + 2) = 0xffff;
      uVar10 = uVar10 + 1;
      uVar5 = uVar5 + 3;
    } while (uVar10 != 0x10);
    break;
  default:
    goto switchD_0014bf20_caseD_3;
  case cCRNFmtDXT5A:
    crnlib::dxt5_block::get_block_values
              ((uint *)acStack_68,(uint)*pSrc_block,(uint)*(byte *)((long)pSrc_block + 1));
    uVar5 = 0;
    uVar10 = 0;
    do {
      bVar3 = *(byte *)((long)pSrc_block + (ulong)(uVar5 >> 3) + 2);
      uVar9 = (uint)bVar3;
      if (uVar10 < 0xe) {
        uVar9 = (uint)CONCAT11(*(undefined1 *)((long)pSrc_block + (ulong)(uVar5 >> 3) + 3),bVar3);
      }
      uVar1 = acStack_68[uVar9 >> ((byte)uVar5 & 7) & 7].field_0.field_0.r;
      *(undefined2 *)(pDst_pixels_u32 + uVar10) = 0xffff;
      *(undefined1 *)((long)pDst_pixels_u32 + uVar10 * 4 + 2) = 0xff;
      *(uchar *)((long)pDst_pixels_u32 + uVar10 * 4 + 3) = uVar1;
      uVar10 = uVar10 + 1;
      uVar5 = uVar5 + 3;
    } while (uVar10 != 0x10);
    break;
  case cCRNFmtETC1:
    crnlib::unpack_etc1((etc1_block *)pSrc_block,(color_quad_u8 *)pDst_pixels_u32,false);
  }
  bVar4 = true;
switchD_0014bf20_caseD_3:
  return bVar4;
}

Assistant:

bool crn_decompress_block(const void* pSrc_block, crn_uint32* pDst_pixels_u32, crn_format crn_fmt)
{
    color_quad_u8* pDst_pixels = reinterpret_cast<color_quad_u8*>(pDst_pixels_u32);

    switch (crn_get_fundamental_dxt_format(crn_fmt))
    {
    case cCRNFmtETC1:
    {
        const etc1_block& block = *reinterpret_cast<const etc1_block*>(pSrc_block);
        unpack_etc1(block, pDst_pixels, false);
        break;
    }
    case cCRNFmtDXT1:
    {
        const dxt1_block* pDXT1_block = reinterpret_cast<const dxt1_block*>(pSrc_block);

        color_quad_u8 colors[cDXT1SelectorValues];
        pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT1_block->get_selector(i & 3, i >> 2);

            pDst_pixels[i] = colors[s];
        }

        break;
    }

    case cCRNFmtDXT3:
    {
        const dxt3_block* pDXT3_block = reinterpret_cast<const dxt3_block*>(pSrc_block);

        const dxt1_block* pDXT1_block = reinterpret_cast<const dxt1_block*>(pSrc_block) + 1;
        color_quad_u8 colors[cDXT1SelectorValues];
        pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT1_block->get_selector(i & 3, i >> 2);
            const uint a = pDXT3_block->get_alpha(i & 3, i >> 2, true);

            pDst_pixels[i] = colors[s];
            pDst_pixels[i].a = static_cast<uint8>(a);
        }

        break;
    }

    case cCRNFmtDXT5:
    {
        const dxt5_block* pDXT5_block = reinterpret_cast<const dxt5_block*>(pSrc_block);

        const dxt1_block* pDXT1_block = reinterpret_cast<const dxt1_block*>(pSrc_block) + 1;
        color_quad_u8 colors[cDXT1SelectorValues];
        pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

        uint values[cDXT5SelectorValues];
        dxt5_block::get_block_values(values, pDXT5_block->get_low_alpha(), pDXT5_block->get_high_alpha());

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT1_block->get_selector(i & 3, i >> 2);
            const uint a = pDXT5_block->get_selector(i & 3, i >> 2);

            pDst_pixels[i] = colors[s];
            pDst_pixels[i].a = static_cast<uint8>(values[a]);
        }
    }

    case cCRNFmtDXN_XY:
    case cCRNFmtDXN_YX:
    {
        const dxt5_block* pDXT5_block0 = reinterpret_cast<const dxt5_block*>(pSrc_block);
        const dxt5_block* pDXT5_block1 = reinterpret_cast<const dxt5_block*>(pSrc_block) + 1;

        uint values0[cDXT5SelectorValues];
        dxt5_block::get_block_values(values0, pDXT5_block0->get_low_alpha(), pDXT5_block0->get_high_alpha());

        uint values1[cDXT5SelectorValues];
        dxt5_block::get_block_values(values1, pDXT5_block1->get_low_alpha(), pDXT5_block1->get_high_alpha());

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s0 = pDXT5_block0->get_selector(i & 3, i >> 2);
            const uint s1 = pDXT5_block1->get_selector(i & 3, i >> 2);

            if (crn_fmt == cCRNFmtDXN_XY)
            {
                pDst_pixels[i].set_noclamp_rgba(values0[s0], values1[s1], 255, 255);
            }
            else
            {
                pDst_pixels[i].set_noclamp_rgba(values1[s1], values0[s0], 255, 255);
            }
        }
        
        break;
    }

    case cCRNFmtDXT5A:
    {
        const dxt5_block* pDXT5_block = reinterpret_cast<const dxt5_block*>(pSrc_block);

        uint values[cDXT5SelectorValues];
        dxt5_block::get_block_values(values, pDXT5_block->get_low_alpha(), pDXT5_block->get_high_alpha());

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT5_block->get_selector(i & 3, i >> 2);

            pDst_pixels[i].set_noclamp_rgba(255, 255, 255, values[s]);
        }

        break;
    }
    default:
    {
        return false;
    }
    }

    return true;
}